

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void asmjit::v1_14::JitAllocatorImpl_removeBlock
               (JitAllocatorPrivateImpl *impl,JitAllocatorBlock *block)

{
  bool bVar1;
  uint32_t uVar2;
  JitAllocatorPool *this;
  size_t sVar3;
  JitAllocatorBlock *in_RSI;
  size_t statIndex;
  JitAllocatorPool *pool;
  Compare<(asmjit::v1_14::Support::SortOrder)0> *in_stack_00000058;
  ZoneTreeNode *in_stack_00000060;
  ZoneTree<asmjit::v1_14::JitAllocatorBlock> *in_stack_00000068;
  JitAllocatorBlock *local_48;
  
  this = JitAllocatorBlock::pool(in_RSI);
  if (this->cursor == in_RSI) {
    if (*(long *)&in_RSI->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> == 0) {
      local_48 = *(JitAllocatorBlock **)&in_RSI->field_0x18;
    }
    else {
      local_48 = *(JitAllocatorBlock **)
                  &in_RSI->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock>;
    }
    this->cursor = local_48;
  }
  ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
  remove<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
            (in_stack_00000068,in_stack_00000060,in_stack_00000058);
  ZoneList<asmjit::v1_14::JitAllocatorBlock>::unlink(&this->blocks,(char *)in_RSI);
  bVar1 = JitAllocatorBlock::hasLargePages((JitAllocatorBlock *)0x14545b);
  this->blockCount = this->blockCount - 1;
  uVar2 = JitAllocatorBlock::areaSize(in_RSI);
  this->totalAreaSize[bVar1] = this->totalAreaSize[bVar1] - (ulong)uVar2;
  uVar2 = JitAllocatorBlock::areaUsed(in_RSI);
  this->totalAreaUsed[bVar1] = this->totalAreaUsed[bVar1] - (ulong)uVar2;
  uVar2 = JitAllocatorBlock::areaSize(in_RSI);
  sVar3 = JitAllocatorImpl_bitVectorSizeToByteSize(uVar2);
  this->totalOverheadBytes = this->totalOverheadBytes - (sVar3 * 2 + 0x68);
  return;
}

Assistant:

static void JitAllocatorImpl_removeBlock(JitAllocatorPrivateImpl* impl, JitAllocatorBlock* block) noexcept {
  JitAllocatorPool* pool = block->pool();

  // Remove from RBTree and List.
  if (pool->cursor == block)
    pool->cursor = block->hasPrev() ? block->prev() : block->next();

  impl->tree.remove(block);
  pool->blocks.unlink(block);

  // Update statistics.
  size_t statIndex = size_t(block->hasLargePages());
  pool->blockCount--;
  pool->totalAreaSize[statIndex] -= block->areaSize();
  pool->totalAreaUsed[statIndex] -= block->areaUsed();
  pool->totalOverheadBytes -= sizeof(JitAllocatorBlock) + JitAllocatorImpl_bitVectorSizeToByteSize(block->areaSize()) * 2u;
}